

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_IndexAccess_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>::
TestBody(ParticleArrayTest_IndexAccess_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>
         *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Particle<(pica::Dimension)2> a;
  Particle<(pica::Dimension)2> a_00;
  Particle<(pica::Dimension)2> b;
  Particle<(pica::Dimension)2> b_00;
  long lVar4;
  char *pcVar5;
  AssertHelper local_488;
  AssertionResult gtest_ar;
  String local_470;
  int numParticles;
  ParticleArray particles;
  AssertHelper local_440;
  ParticleArray constParticles;
  double adStack_420 [2];
  undefined2 uStack_410;
  undefined6 uStack_40e;
  undefined2 auStack_408 [4];
  undefined8 uStack_400;
  ParticleType particleArray [15];
  
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  numParticles = 0xf;
  lVar4 = 0x38;
  do {
    *(undefined8 *)((long)adStack_420 + lVar4) = 0;
    *(undefined8 *)((long)adStack_420 + lVar4 + 8) = 0;
    *(undefined8 *)
     ((long)&constParticles.particles.
             super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + lVar4) = 0;
    *(undefined8 *)
     ((long)&constParticles.particles.
             super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4) = 0;
    *(undefined8 *)((long)&uStack_410 + lVar4) = 0;
    *(undefined8 *)((long)auStack_408 + lVar4) = 0x3ff0000000000000;
    *(undefined8 *)((long)particleArray + lVar4 + -8) = 0x3ff0000000000000;
    *(undefined2 *)((long)&particleArray[0].position.x + lVar4) = 0;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x3f8);
  for (lVar4 = 0; lVar4 != 0x3c0; lVar4 = lVar4 + 0x40) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              ((Particle *)&constParticles,
               (BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this);
    *(ulong *)((long)&particleArray[0].factor + lVar4 + 2) = CONCAT26(auStack_408[0],uStack_40e);
    *(undefined8 *)((long)&particleArray[0].invGamma + lVar4 + 2) = stack0xfffffffffffffbfa;
    *(double *)((long)&particleArray[0].p.z + lVar4) = adStack_420[1];
    *(ulong *)((long)&particleArray[0].factor + lVar4) = CONCAT62(uStack_40e,uStack_410);
    *(pointer *)((long)&particleArray[0].p.x + lVar4) =
         constParticles.particles.
         super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(double *)((long)&particleArray[0].p.y + lVar4) = adStack_420[0];
    *(pointer *)((long)&particleArray[0].position.x + lVar4) =
         constParticles.particles.
         super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)((long)&particleArray[0].position.y + lVar4) =
         constParticles.particles.
         super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
    ::push_back(&particles.particles,(Particle *)&constParticles);
  }
  std::
  vector<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>::
  vector(&constParticles.particles,&particles.particles);
  local_470.c_str_._0_4_ =
       (undefined4)
       ((ulong)((long)particles.particles.
                      super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)particles.particles.
                     super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 6);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"numParticles","particles.size()",&numParticles,(int *)&local_470
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_470);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x56,pcVar5);
    testing::internal::AssertHelper::operator=(&local_488,(Message *)&local_470);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_470.c_str_._0_4_ =
         (undefined4)
         ((ulong)((long)constParticles.particles.
                        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)constParticles.particles.
                       super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 6);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"numParticles","constParticles.size()",&numParticles,
               (int *)&local_470);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      for (lVar4 = 0; lVar4 != 0x3c0; lVar4 = lVar4 + 0x40) {
        puVar1 = (undefined8 *)
                 ((long)&((particles.particles.
                           super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->p).x + lVar4);
        puVar2 = (undefined8 *)
                 ((long)&((particles.particles.
                           super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->p).z + lVar4);
        puVar3 = (undefined8 *)
                 ((long)&(particles.particles.
                          super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->invGamma + lVar4);
        a.position.y = (double)*(undefined8 *)((long)&particleArray[0].position.y + lVar4);
        a.position.x = (double)*(undefined8 *)((long)&particleArray[0].position.x + lVar4);
        a.p.x = (double)*(undefined8 *)((long)&particleArray[0].p.x + lVar4);
        a.p.y = (double)*(undefined8 *)((long)&particleArray[0].p.y + lVar4);
        a.p.z = (double)*(undefined8 *)((long)&particleArray[0].p.z + lVar4);
        a.factor = (FactorType)*(undefined8 *)((long)&particleArray[0].factor + lVar4);
        a.invGamma = (GammaType)*(undefined8 *)((long)&particleArray[0].invGamma + lVar4);
        a._56_8_ = *(undefined8 *)((long)&particleArray[0].typeIndex + lVar4);
        b.p.x = (double)*puVar1;
        b.position = (PositionType)
                     *(undefined1 (*) [16])
                      ((long)&((particles.particles.
                                super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->position).x + lVar4);
        b.p.y = (double)puVar1[1];
        b.p.z = (double)*puVar2;
        b.factor = (FactorType)puVar2[1];
        b.invGamma = (GammaType)*puVar3;
        b._56_8_ = puVar3[1];
        gtest_ar.success_ =
             BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
             eqParticles_<pica::Particle<(pica::Dimension)2>,pica::Particle<(pica::Dimension)2>>
                       ((BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *)this,a,b);
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!gtest_ar.success_) {
          testing::Message::Message((Message *)&local_488);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)&local_470,&gtest_ar,
                     "this->eqParticles_(particleArray[i], particles[i])","false","true");
          testing::internal::AssertHelper::AssertHelper
                    (&local_440,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                     ,0x59,(char *)CONCAT44(local_470.c_str_._4_4_,local_470.c_str_._0_4_));
          testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_488);
          testing::internal::AssertHelper::~AssertHelper(&local_440);
          testing::internal::String::~String(&local_470);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_488);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        puVar1 = (undefined8 *)
                 ((long)&((constParticles.particles.
                           super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->p).x + lVar4);
        puVar2 = (undefined8 *)
                 ((long)&((constParticles.particles.
                           super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->p).z + lVar4);
        puVar3 = (undefined8 *)
                 ((long)&(constParticles.particles.
                          super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->invGamma + lVar4);
        a_00.position.y = (double)*(undefined8 *)((long)&particleArray[0].position.y + lVar4);
        a_00.position.x = (double)*(undefined8 *)((long)&particleArray[0].position.x + lVar4);
        a_00.p.x = (double)*(undefined8 *)((long)&particleArray[0].p.x + lVar4);
        a_00.p.y = (double)*(undefined8 *)((long)&particleArray[0].p.y + lVar4);
        a_00.p.z = (double)*(undefined8 *)((long)&particleArray[0].p.z + lVar4);
        a_00.factor = (FactorType)*(undefined8 *)((long)&particleArray[0].factor + lVar4);
        a_00.invGamma = (GammaType)*(undefined8 *)((long)&particleArray[0].invGamma + lVar4);
        a_00._56_8_ = *(undefined8 *)((long)&particleArray[0].typeIndex + lVar4);
        b_00.p.x = (double)*puVar1;
        b_00.position =
             (PositionType)
             *(undefined1 (*) [16])
              ((long)&((constParticles.particles.
                        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->position).x + lVar4);
        b_00.p.y = (double)puVar1[1];
        b_00.p.z = (double)*puVar2;
        b_00.factor = (FactorType)puVar2[1];
        b_00.invGamma = (GammaType)*puVar3;
        b_00._56_8_ = puVar3[1];
        gtest_ar.success_ =
             BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
             eqParticles_<pica::Particle<(pica::Dimension)2>,pica::Particle<(pica::Dimension)2>>
                       ((BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *)this,a_00,b_00);
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!gtest_ar.success_) {
          testing::Message::Message((Message *)&local_488);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)&local_470,&gtest_ar,
                     "this->eqParticles_(particleArray[i], constParticles[i])","false","true");
          testing::internal::AssertHelper::AssertHelper
                    (&local_440,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                     ,0x5a,(char *)CONCAT44(local_470.c_str_._4_4_,local_470.c_str_._0_4_));
          testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_488);
          testing::internal::AssertHelper::~AssertHelper(&local_440);
          testing::internal::String::~String(&local_470);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_488);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
      goto LAB_0019fd0a;
    }
    testing::Message::Message((Message *)&local_470);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x57,pcVar5);
    testing::internal::AssertHelper::operator=(&local_488,(Message *)&local_470);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_488);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_470);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
LAB_0019fd0a:
  std::
  _Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ::~_Vector_base((_Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                   *)&constParticles);
  std::
  _Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ::~_Vector_base((_Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                   *)&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, IndexAccess)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    const int numParticles = 15;
    ParticleType particleArray[numParticles];
    for (int i = 0; i < numParticles; i++) {
        ParticleType particle = this->randomParticle();
        particleArray[i] = particle;
        particles.pushBack(particle);
    }
    const ParticleArray constParticles = particles;
    ASSERT_EQ(numParticles, particles.size());
    ASSERT_EQ(numParticles, constParticles.size());
    for (int i = 0; i < numParticles; i++) {
        EXPECT_TRUE(this->eqParticles_(particleArray[i], particles[i]));
        EXPECT_TRUE(this->eqParticles_(particleArray[i], constParticles[i]));
    }
}